

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

int CServer::NewClientCallback(int ClientID,void *pUser)

{
  uint uVar1;
  IGameServer *pIVar2;
  CServer *in_RSI;
  uint in_EDI;
  CServer *pThis;
  CServer *this;
  
  this = in_RSI;
  pIVar2 = GameServer(in_RSI);
  uVar1 = (*(pIVar2->super_IInterface)._vptr_IInterface[0xf])(pIVar2,(ulong)in_EDI);
  if ((uVar1 & 1) != 0) {
    pIVar2 = GameServer(in_RSI);
    (*(pIVar2->super_IInterface)._vptr_IInterface[0xc])(pIVar2,(ulong)in_EDI,"removing dummy");
  }
  in_RSI->m_aClients[(int)in_EDI].m_State = 1;
  in_RSI->m_aClients[(int)in_EDI].m_aName[0] = '\0';
  in_RSI->m_aClients[(int)in_EDI].m_aClan[0] = '\0';
  in_RSI->m_aClients[(int)in_EDI].m_Country = -1;
  in_RSI->m_aClients[(int)in_EDI].m_Authed = 0;
  in_RSI->m_aClients[(int)in_EDI].m_AuthTries = 0;
  in_RSI->m_aClients[(int)in_EDI].m_pRconCmdToSend = (CCommandInfo *)0x0;
  in_RSI->m_aClients[(int)in_EDI].m_pMapListEntryToSend = (CMapListEntry *)0x0;
  in_RSI->m_aClients[(int)in_EDI].m_NoRconNote = false;
  in_RSI->m_aClients[(int)in_EDI].m_Quitting = false;
  in_RSI->m_aClients[(int)in_EDI].m_Latency = 0;
  CClient::Reset((CClient *)this);
  return 0;
}

Assistant:

int CServer::NewClientCallback(int ClientID, void *pUser)
{
	CServer *pThis = (CServer *)pUser;

	// Remove non human player on same slot
	if(pThis->GameServer()->IsClientBot(ClientID))
	{
		pThis->GameServer()->OnClientDrop(ClientID, "removing dummy");
	}

	pThis->m_aClients[ClientID].m_State = CClient::STATE_AUTH;
	pThis->m_aClients[ClientID].m_aName[0] = 0;
	pThis->m_aClients[ClientID].m_aClan[0] = 0;
	pThis->m_aClients[ClientID].m_Country = -1;
	pThis->m_aClients[ClientID].m_Authed = AUTHED_NO;
	pThis->m_aClients[ClientID].m_AuthTries = 0;
	pThis->m_aClients[ClientID].m_pRconCmdToSend = 0;
	pThis->m_aClients[ClientID].m_pMapListEntryToSend = 0;
	pThis->m_aClients[ClientID].m_NoRconNote = false;
	pThis->m_aClients[ClientID].m_Quitting = false;
	pThis->m_aClients[ClientID].m_Latency = 0;
	pThis->m_aClients[ClientID].Reset();

	return 0;
}